

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::UniformLocNegativeLinkLocationReused2::UniformLocNegativeLinkLocationReused2
          (UniformLocNegativeLinkLocationReused2 *this)

{
  UniformLocNegativeLinkLocationReused2 *this_local;
  
  ExplicitUniformLocationCaseBase::ExplicitUniformLocationCaseBase
            (&this->super_ExplicitUniformLocationCaseBase);
  (this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__UniformLocNegativeLinkLocationReused2_0324a880;
  return;
}

Assistant:

virtual long Run()
	{
		///layout (location = 2) uniform float u0;
		//layout (location = 2) uniform float u1;
		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_VEC4, Loc::C(2), DefOccurence::FSH_OR_CSH));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_VEC4, Loc::C(2), DefOccurence::ALL_BUT_FSH));
		return doRunNegativeLink(uniforms);
	}